

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O1

void __thiscall
BRTS_XZ<TTA>::PerformLabelingMem
          (BRTS_XZ<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint height;
  int iVar5;
  Mat1b *pMVar6;
  long lVar7;
  long lVar8;
  pointer puVar9;
  pointer piVar10;
  Run *pRVar11;
  uint64_t *puVar12;
  Run *pRVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  double dVar19;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  Size local_2a0;
  undefined1 local_298 [8];
  void *pvStack_290;
  Size local_288;
  undefined4 local_238;
  Mat *local_230;
  undefined8 local_228;
  undefined1 local_220 [104];
  Mat local_1b8 [16];
  long local_1a8;
  long *local_170;
  MemMat<unsigned_char> local_158;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat(&local_158,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar14 = **(ulong **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_2a0 = (Size)(uVar14 << 0x20 | uVar14 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_220,&local_2a0,0);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar4 = *(uint *)&pMVar6->field_0xc;
  height = *(uint *)&pMVar6->field_0x8;
  (this->data_compressed).height = height;
  (this->data_compressed).width = uVar4;
  uVar15 = uVar4 + 0x3f;
  if (-1 < (long)(int)uVar4) {
    uVar15 = uVar4;
  }
  iVar16 = ((int)uVar15 >> 6) + 1;
  (this->data_compressed).data_width = iVar16;
  iVar16 = iVar16 * height;
  uVar14 = 0xffffffffffffffff;
  if (-1 < iVar16) {
    uVar14 = (long)iVar16 * 8;
  }
  puVar12 = (uint64_t *)operator_new__(uVar14);
  (this->data_compressed).bits = puVar12;
  InitCompressedDataMem(this,&this->data_compressed,&local_158);
  (this->data_runs).height = height;
  (this->data_runs).width = uVar4;
  pRVar13 = (Run *)operator_new__((ulong)(((uVar4 >> 1) + 2) * height + 1) << 3);
  (this->data_runs).runs = pRVar13;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar16 = *(int *)&pMVar6->field_0x8;
  iVar5 = *(int *)&pMVar6->field_0xc;
  TTA::MemAlloc(((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1) *
                ((iVar16 - (iVar16 + 1 >> 0x1f)) + 1 >> 1) + 1);
  *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  TTA::length_ = 1;
  FindRunsMem(this,(this->data_compressed).bits,height,(this->data_compressed).data_width,
              (this->data_runs).runs);
  if (0 < (int)height) {
    pRVar13 = (this->data_runs).runs;
    uVar14 = 0;
    do {
      piVar10 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar9 = TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar16 = 0;
      pRVar11 = pRVar13;
      do {
        pRVar13 = pRVar11;
        uVar2 = pRVar13->start_pos;
        if (uVar2 == 0xffff) {
          if (iVar16 < (int)uVar4) {
            lVar17 = (long)iVar16;
            lVar7 = *local_170;
            lVar8 = *(long *)local_220._80_8_;
            lVar18 = 0;
            do {
              piVar1 = (int *)(lVar7 * uVar14 + lVar17 * 4 + local_1a8 + lVar18 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar8 * uVar14 + lVar17 * 4 + local_220._24_8_ + lVar18 * 4) = 0;
              lVar18 = lVar18 + 1;
            } while ((int)uVar4 - lVar17 != lVar18);
            iVar16 = iVar16 + (int)lVar18;
          }
          pRVar13 = pRVar13 + 1;
        }
        else {
          uVar3 = pRVar13->end_pos;
          uVar15 = pRVar13->label;
          piVar10[(int)uVar15] = piVar10[(int)uVar15] + 1;
          uVar15 = puVar9[(int)uVar15];
          if (iVar16 < (int)(uint)uVar2) {
            lVar17 = (long)iVar16;
            lVar7 = *local_170;
            lVar8 = *(long *)local_220._80_8_;
            lVar18 = 0;
            do {
              piVar1 = (int *)(lVar7 * uVar14 + lVar17 * 4 + local_1a8 + lVar18 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar8 * uVar14 + lVar17 * 4 + local_220._24_8_ + lVar18 * 4) = 0;
              lVar18 = lVar18 + 1;
            } while ((ulong)uVar2 - lVar17 != lVar18);
            iVar16 = iVar16 + (int)lVar18;
          }
          if (iVar16 < (int)(uint)uVar3) {
            lVar18 = (long)iVar16;
            lVar7 = *local_170;
            lVar8 = *(long *)local_220._80_8_;
            lVar17 = 0;
            do {
              piVar1 = (int *)(lVar7 * uVar14 + lVar18 * 4 + local_1a8 + lVar17 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(lVar18 * 4 + lVar8 * uVar14 + local_220._24_8_ + lVar17 * 4) = uVar15;
              lVar17 = lVar17 + 1;
            } while ((ulong)uVar3 - lVar18 != lVar17);
            iVar16 = iVar16 + (int)lVar17;
          }
        }
        pRVar11 = pRVar13 + 1;
      } while (uVar2 != 0xffff);
      uVar14 = uVar14 + 1;
    } while (uVar14 != height);
  }
  local_298 = (undefined1  [8])0x0;
  pvStack_290 = (void *)0x0;
  local_288.width = 0;
  local_288.height = 0;
  local_298 = (undefined1  [8])operator_new(0x20);
  pvStack_290 = (void *)((long)local_298 + 0x20);
  *(undefined8 *)((long)local_298 + 0x10) = 0;
  *(undefined8 *)((long)local_298 + 0x18) = 0;
  *(undefined8 *)local_298 = 0;
  *(undefined8 *)((long)local_298 + 8) = 0;
  local_288 = (Size)pvStack_290;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(accesses,local_298);
  if (local_298 != (undefined1  [8])0x0) {
    operator_delete((void *)local_298,(long)local_288 - (long)local_298);
  }
  local_228 = 0;
  local_238 = 0x81010004;
  local_230 = &local_158.accesses_.super_Mat;
  cv::sum((_InputArray *)local_298);
  *(accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_298 - 9.223372036854776e+18) & (long)(double)local_298 >> 0x3f |
       (long)(double)local_298;
  local_228 = 0;
  local_238 = 0x81010004;
  local_230 = local_1b8;
  cv::sum((_InputArray *)local_298);
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)(double)local_298 >> 0x3f & (long)((double)local_298 - 9.223372036854776e+18) |
       (long)(double)local_298;
  dVar19 = TTA::MemTotalAccesses();
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] =
       (long)dVar19 >> 0x3f & (long)(dVar19 - 9.223372036854776e+18) | (long)dVar19;
  MemMat<int>::GetImage((Mat_<int> *)local_298,(MemMat<int> *)local_220);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     (Mat *)local_298);
  cv::Mat::~Mat((Mat *)local_298);
  pRVar13 = (this->data_runs).runs;
  if (pRVar13 != (Run *)0x0) {
    operator_delete__(pRVar13);
  }
  puVar12 = (this->data_compressed).bits;
  if (puVar12 != (uint64_t *)0x0) {
    operator_delete__(puVar12);
  }
  cv::Mat::~Mat(local_1b8);
  cv::Mat::~Mat((Mat *)(local_220 + 8));
  cv::Mat::~Mat(&local_158.accesses_.super_Mat);
  cv::Mat::~Mat(&local_158.img_.super_Mat);
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedDataMem(data_compressed, img);

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();
        FindRunsMem(data_compressed.bits, h, data_compressed.data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h; i++) {
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (; j < w; j++) img_labels(i, j) = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::MemGetLabel(runs->label);
                for (; j < start_pos; j++) img_labels(i, j) = 0;
                for (; j < end_pos; j++) img_labels(i, j) = label;
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();
        data_runs.Dealloc();
        data_compressed.Dealloc();
    }